

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_condest.c
# Opt level: O2

double lu_normest(lu_int m,lu_int *Ubegin,lu_int *Ui,double *Ux,double *pivot,lu_int *perm,int upper
                 ,double *work)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_60;
  
  iVar3 = m + -1;
  iVar4 = 0;
  if (upper == 0) {
    iVar4 = iVar3;
  }
  local_60 = 0.0;
  dVar7 = 0.0;
  for (lVar5 = (long)iVar4; lVar5 != (int)(-(uint)(upper == 0) | m);
      lVar5 = lVar5 + (ulong)(upper != 0) * 2 + -1) {
    if (perm == (lu_int *)0x0) {
      iVar4 = (int)lVar5;
    }
    else {
      iVar4 = perm[lVar5];
    }
    dVar6 = 0.0;
    for (lVar1 = (long)Ubegin[iVar4] << 2; -1 < (long)*(int *)((long)Ui + lVar1); lVar1 = lVar1 + 4)
    {
      dVar6 = dVar6 - work[*(int *)((long)Ui + lVar1)] * *(double *)((long)Ux + lVar1 * 2);
    }
    dVar6 = dVar6 + *(double *)(&DAT_003990c0 + (ulong)(0.0 <= dVar6) * 8);
    if (pivot != (double *)0x0) {
      dVar6 = dVar6 / pivot[iVar4];
    }
    work[iVar4] = dVar6;
    local_60 = local_60 + ABS(dVar6);
    dVar7 = fmax(dVar7,ABS(dVar6));
  }
  if (upper == 0) {
    iVar3 = 0;
  }
  dVar6 = 0.0;
  for (lVar5 = (long)iVar3; lVar5 != (int)(-(uint)(upper != 0) | m);
      lVar5 = lVar5 + (ulong)(upper == 0) * 2 + -1) {
    if (perm == (lu_int *)0x0) {
      iVar3 = (int)lVar5;
    }
    else {
      iVar3 = perm[lVar5];
    }
    if (pivot == (double *)0x0) {
      dVar8 = work[iVar3];
    }
    else {
      dVar8 = work[iVar3] / pivot[iVar3];
      work[iVar3] = dVar8;
    }
    for (lVar1 = (long)Ubegin[iVar3] << 2; lVar2 = (long)*(int *)((long)Ui + lVar1), -1 < lVar2;
        lVar1 = lVar1 + 4) {
      work[lVar2] = *(double *)((long)Ux + lVar1 * 2) * -dVar8 + work[lVar2];
    }
    dVar6 = dVar6 + ABS(dVar8);
  }
  dVar7 = fmax(dVar6 / local_60,dVar7);
  return dVar7;
}

Assistant:

double lu_normest(
    lu_int m, const lu_int *Ubegin, const lu_int *Ui, const double *Ux,
    const double *pivot, const lu_int *perm, int upper, double *work)
{
    lu_int i, j, k, kbeg, kend, kinc, p;
    double x1norm, xinfnorm, y1norm, temp;

    x1norm = 0;
    xinfnorm = 0;
    if (upper)
    {
        kbeg = 0; kend = m; kinc = 1;
    }
    else
    {
        kbeg = m-1; kend = -1; kinc = -1;
    }
    for (k = kbeg; k != kend; k += kinc)
    {
        j = perm ? perm[k] : k;
        temp = 0;
        for (p = Ubegin[j]; (i = Ui[p]) >= 0; p++)
            temp -= work[i] * Ux[p];
        temp += temp >= 0 ? 1 : -1; /* choose b[i] = 1 or b[i] = -1 */
        if (pivot) temp /= pivot[j];
        work[j] = temp;
        x1norm += fabs(temp);
        xinfnorm = fmax(xinfnorm, fabs(temp));
    }

    y1norm = 0;
    if (upper)
    {
        kbeg = m-1; kend = -1; kinc = -1;
    }
    else
    {
        kbeg = 0; kend = m; kinc = 1;
    }
    for (k = kbeg; k != kend; k += kinc)
    {
        j = perm ? perm[k] : k;
        if (pivot) work[j] /= pivot[j];
        temp = work[j];
        for (p = Ubegin[j]; (i = Ui[p]) >= 0; p++)
            work[i] -= temp * Ux[p];
        y1norm += fabs(temp);
    }

    return fmax(y1norm/x1norm, xinfnorm);
}